

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

optional<long> __thiscall
anon_unknown.dwarf_2e6623f::AddressDescriptor::ScriptSize(AddressDescriptor *this)

{
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar1;
  long in_FS_OFFSET;
  optional<long> oVar2;
  direct_or_indirect local_30;
  uint local_14;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  GetScriptForDestination((CScript *)&local_30.indirect_contents,&this->m_destination);
  uVar1 = extraout_RDX;
  if (0x1c < local_14) {
    local_14 = local_14 - 0x1d;
    free(local_30.indirect_contents.indirect);
    local_30.indirect_contents.indirect = (char *)0x0;
    uVar1 = extraout_RDX_00;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value._4_4_ = 0;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_payload._M_value._0_4_ = local_14;
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_
         = (undefined7)((ulong)uVar1 >> 8);
    oVar2.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
    _M_engaged = true;
    return (optional<long>)
           oVar2.super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<int64_t> ScriptSize() const override { return GetScriptForDestination(m_destination).size(); }